

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# library.cpp
# Opt level: O3

CK_C_GetFunctionList loadLibrary(char *module,void **moduleHandle,char **pErrMsg)

{
  void *pvVar1;
  char *pcVar2;
  CK_C_GetFunctionList p_Var3;
  
  if (module == (char *)0x0) {
    module = "/usr/local/lib/softhsm/libsofthsm2.so";
  }
  pvVar1 = (void *)dlopen(module,2);
  pcVar2 = (char *)dlerror();
  *pErrMsg = pcVar2;
  if (pvVar1 == (void *)0x0 || pcVar2 != (char *)0x0) {
    if (pvVar1 == (void *)0x0) {
      return (CK_C_GetFunctionList)0x0;
    }
  }
  else {
    p_Var3 = (CK_C_GetFunctionList)dlsym(pvVar1,"C_GetFunctionList");
    pcVar2 = (char *)dlerror();
    *pErrMsg = pcVar2;
    if (pcVar2 == (char *)0x0) {
      *moduleHandle = pvVar1;
      return p_Var3;
    }
  }
  dlclose(pvVar1);
  return (CK_C_GetFunctionList)0x0;
}

Assistant:

CK_C_GetFunctionList loadLibrary(char* module, void** moduleHandle,
				char **pErrMsg)
{
	CK_C_GetFunctionList pGetFunctionList = NULL;

#if defined(HAVE_LOADLIBRARY)
	HINSTANCE hDLL = NULL;
	DWORD dw = NULL;
	static char errMsg[100];

	// Load PKCS #11 library
	if (module)
	{
		hDLL = LoadLibraryA(module);
	}
	else
	{
		hDLL = LoadLibraryA(DEFAULT_PKCS11_LIB);
	}

	if (hDLL == NULL)
	{
		// Failed to load the PKCS #11 library
		dw = GetLastError();
		snprintf((char*)errMsg, sizeof(errMsg), "LoadLibraryA failed: 0x%08X", dw);
		*pErrMsg = errMsg;
		return NULL;
	}
	else
	{
		*pErrMsg = NULL;
	}

	// Retrieve the entry point for C_GetFunctionList
	pGetFunctionList = (CK_C_GetFunctionList) GetProcAddress(hDLL, "C_GetFunctionList");
	if (pGetFunctionList == NULL)
	{
		dw = GetLastError();
		snprintf((char*)errMsg, sizeof(errMsg), "getProcAddress failed: 0x%08X", dw);
		*pErrMsg = errMsg;
		FreeLibrary(hDLL);
		return NULL;
	}

	// Store the handle so we can FreeLibrary it later
	*moduleHandle = hDLL;

#elif defined(HAVE_DLOPEN)
	void* pDynLib = NULL;

	// Load PKCS #11 library
	if (module)
	{
		pDynLib = dlopen(module, RTLD_NOW | RTLD_LOCAL);
	}
	else
	{
		pDynLib = dlopen(DEFAULT_PKCS11_LIB, RTLD_NOW | RTLD_LOCAL);
	}

	*pErrMsg = dlerror();
	if (pDynLib == NULL || *pErrMsg != NULL)
	{
		if (pDynLib != NULL) dlclose(pDynLib);

		// Failed to load the PKCS #11 library
		return NULL;
	}

	// Retrieve the entry point for C_GetFunctionList
	pGetFunctionList = (CK_C_GetFunctionList) dlsym(pDynLib, "C_GetFunctionList");

	// Store the handle so we can dlclose it later
	*pErrMsg = dlerror();
	if (*pErrMsg != NULL)
	{
		dlclose(pDynLib);

		// An error occured during dlsym()
		return NULL;
	}

	*moduleHandle = pDynLib;
#else
	fprintf(stderr, "ERROR: Not compiled with library support.\n");

	return NULL;
#endif

	return pGetFunctionList;
}